

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

bool __thiscall
mjs::gc_heap::type_check<mjs::gc_vector<mjs::object::property>>(gc_heap *this,uint32_t pos)

{
  uint uVar1;
  
  uVar1 = pos - 1;
  if (((this->alloc_context_).start_ <= uVar1) && (uVar1 < (this->alloc_context_).next_free_)) {
    return gc_type_info_registration<mjs::gc_vector<mjs::object::property>>::reg._40_4_ ==
           *(int *)((long)(this->alloc_context_).storage_ + (ulong)uVar1 * 8 + 4);
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

bool type_check(uint32_t pos) const {
        const auto a = get_at(pos-1)->allocation;
        if constexpr (std::is_convertible_v<T*, object*>) {
            // Avoid creating gc_type_info_registration<T>'s for interface types
            return a.type_info().is_convertible_to_object() && dynamic_cast<T*>(reinterpret_cast<object*>(get_at(pos)));
        } else {
            return gc_type_info_registration<T>::index()  == a.type;
        }
    }